

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_IteratorNext(JSContext *ctx,JSValue enum_obj,JSValue method,int argc,JSValue *argv,
                       BOOL *pdone)

{
  JSValue v;
  JSValue v_00;
  JSValue val;
  JSValue enum_obj_00;
  JSValue JVar1;
  int iVar2;
  int64_t in_RCX;
  JSValueUnion in_RDI;
  undefined4 in_R9D;
  JSValue JVar3;
  int *in_stack_00000010;
  JSAtom in_stack_0000002c;
  JSContext *in_stack_00000030;
  undefined1 in_stack_00000038 [16];
  JSValue in_stack_00000048;
  int done;
  JSValue done_val;
  JSValue value;
  JSValue obj;
  BOOL in_stack_000000d0;
  JSContext *ctx_00;
  JSValueUnion in_stack_fffffffffffffee8;
  int64_t in_stack_fffffffffffffef0;
  uint uStack_104;
  JSValueUnion JVar4;
  int64_t local_e0;
  undefined1 local_d4 [12];
  JSValueUnion local_c8;
  JSValueUnion local_c0;
  undefined8 in_stack_ffffffffffffff48;
  JSContext *in_stack_ffffffffffffff50;
  JSValueUnion JVar5;
  undefined8 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff90;
  int32_t iVar6;
  undefined4 in_stack_ffffffffffffff94;
  int *in_stack_ffffffffffffff98;
  JSValueUnion local_40;
  int64_t local_38;
  JSValueUnion local_10;
  JSValueUnion local_8;
  
  ctx_00 = (JSContext *)local_d4;
  enum_obj_00.tag = in_RCX;
  enum_obj_00.u.float64 = in_RDI.float64;
  JVar3.tag._0_4_ = in_stack_ffffffffffffff60;
  JVar3.u = (JSValueUnion)in_stack_ffffffffffffff58;
  JVar3.tag._4_4_ = in_R9D;
  JVar3 = JS_IteratorNext2(in_stack_ffffffffffffff50,enum_obj_00,JVar3,
                           SUB84(in_stack_ffffffffffffff48,4),
                           (JSValue *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff98);
  JVar4 = JVar3.u;
  local_e0 = JVar3.tag;
  JVar5 = JVar4;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    if (local_d4._0_4_ != 2) {
      *in_stack_00000010 = local_d4._0_4_;
      iVar6 = JVar5.int32;
      in_stack_ffffffffffffff94 = JVar5._4_4_;
      goto LAB_0016634f;
    }
    JVar3 = JS_GetPropertyInternal
                      (in_stack_00000030,in_stack_00000048,in_stack_0000002c,
                       (JSValue)in_stack_00000038,in_stack_000000d0);
    local_10 = JVar3.u;
    local_8 = (JSValueUnion)JVar3.tag;
    local_d4._4_8_ = local_10;
    local_c8.ptr = (void *)local_8;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 == 0) {
      val.tag = (int64_t)JVar4.ptr;
      val.u.float64 = local_8.float64;
      iVar2 = JS_ToBoolFree((JSContext *)local_10.ptr,val);
      *in_stack_00000010 = iVar2;
      local_c0.ptr = (void *)((ulong)uStack_104 << 0x20);
      local_38 = 3;
      if (*in_stack_00000010 == 0) {
        JVar3 = JS_GetPropertyInternal
                          (in_stack_00000030,in_stack_00000048,in_stack_0000002c,
                           (JSValue)in_stack_00000038,in_stack_000000d0);
        local_40 = JVar3.u;
        local_38 = JVar3.tag;
        local_c0.float64 = local_40.float64;
        in_stack_fffffffffffffee8 = local_40;
        in_stack_fffffffffffffef0 = local_38;
      }
      v.tag = in_stack_fffffffffffffef0;
      v.u.ptr = in_stack_fffffffffffffee8.ptr;
      JS_FreeValue(ctx_00,v);
      iVar6 = local_c0.int32;
      in_stack_ffffffffffffff94 = local_c0._4_4_;
      local_e0 = local_38;
      goto LAB_0016634f;
    }
  }
  v_00.tag = in_stack_fffffffffffffef0;
  v_00.u.ptr = in_stack_fffffffffffffee8.ptr;
  JS_FreeValue(ctx_00,v_00);
  *in_stack_00000010 = 0;
  iVar6 = 0;
  local_e0 = 6;
LAB_0016634f:
  JVar1.u._4_4_ = in_stack_ffffffffffffff94;
  JVar1.u.int32 = iVar6;
  JVar1.tag = local_e0;
  return JVar1;
}

Assistant:

static JSValue JS_IteratorNext(JSContext *ctx, JSValueConst enum_obj,
                               JSValueConst method,
                               int argc, JSValueConst *argv, BOOL *pdone)
{
    JSValue obj, value, done_val;
    int done;

    obj = JS_IteratorNext2(ctx, enum_obj, method, argc, argv, &done);
    if (JS_IsException(obj))
        goto fail;
    if (done != 2) {
        *pdone = done;
        return obj;
    } else {
        done_val = JS_GetProperty(ctx, obj, JS_ATOM_done);
        if (JS_IsException(done_val))
            goto fail;
        *pdone = JS_ToBoolFree(ctx, done_val);
        value = JS_UNDEFINED;
        if (!*pdone) {
            value = JS_GetProperty(ctx, obj, JS_ATOM_value);
        }
        JS_FreeValue(ctx, obj);
        return value;
    }
 fail:
    JS_FreeValue(ctx, obj);
    *pdone = FALSE;
    return JS_EXCEPTION;
}